

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

tensor * __thiscall sub::forward(sub *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pptVar5;
  tensor *ptVar6;
  tensor *ptVar7;
  pointer pdVar8;
  tensor *ptVar9;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar9 = (tensor *)operator_new(0x20);
  ptVar9->data = 0.0;
  ptVar9->grad = 0.0;
  ptVar9->cnt = 0;
  ptVar9->cnt_free = 0;
  ptVar9->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar9;
  pptVar5 = (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ptVar6 = *pptVar5;
  ptVar7 = pptVar5[1];
  ptVar9->data = ptVar6->data - ptVar7->data;
  pdVar8 = (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar8 = 1.0;
  pdVar8[1] = -1.0;
  uVar1 = ptVar6->cnt;
  uVar3 = ptVar6->cnt_free;
  ptVar6->cnt = uVar1 + 1;
  ptVar6->cnt_free = uVar3 + 1;
  uVar2 = ptVar7->cnt;
  uVar4 = ptVar7->cnt_free;
  ptVar7->cnt = uVar2 + 1;
  ptVar7->cnt_free = uVar4 + 1;
  ptVar9->hook = &this->super_node;
  return ptVar9;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data-input[1]->data;
        grad_fn[0]=1;
        grad_fn[1]=-1;
        input[0]->cnt++;
        input[0]->cnt_free++;
        input[1]->cnt++;
        input[1]->cnt_free++;
        ret->hook=this;
        return ret;
    }